

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool __thiscall
cmDependsFortran::WriteDependenciesReal
          (cmDependsFortran *this,string *obj,cmFortranSourceInfo *info,string *mod_dir,
          string *stamp_dir,ostream *makeDepends,ostream *internalDepends)

{
  _Base_ptr __k;
  cmLocalGenerator *pcVar1;
  cmMakefile *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  bool bVar4;
  string *psVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  const_iterator cVar8;
  iterator iVar9;
  char *pcVar10;
  _Base_ptr p_Var11;
  string stampFile;
  string stampFileForShell;
  string obj_m;
  string binDir;
  string stampFile_1;
  string stampFileForMake;
  string obj_i;
  allocator<char> local_159;
  cmFortranSourceInfo *local_158;
  string local_150;
  _Base_ptr local_130;
  _Base_ptr local_128;
  string local_120;
  string local_100;
  string local_e0;
  string *local_c0;
  string *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_158 = info;
  local_c0 = stamp_dir;
  local_b8 = mod_dir;
  psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((this->super_cmDepends).LocalGenerator);
  std::__cxx11::string::string((string *)&local_e0,(string *)psVar5);
  MaybeConvertToRelativePath(&local_70,this,&local_e0,obj);
  cmSystemTools::ConvertToOutputPath(&local_100,&local_70);
  poVar6 = std::operator<<(internalDepends,(string *)&local_70);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = std::operator<<(internalDepends," ");
  poVar6 = std::operator<<(poVar6,(string *)local_158);
  std::endl<char,std::char_traits<char>>(poVar6);
  psVar2 = &local_158->Includes;
  for (p_Var7 = (local_158->Includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &(psVar2->_M_t)._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    poVar6 = std::operator<<(makeDepends,(string *)&local_100);
    poVar6 = std::operator<<(poVar6,": ");
    MaybeConvertToRelativePath(&local_b0,this,&local_e0,(string *)(p_Var7 + 1));
    cmSystemTools::ConvertToOutputPath(&local_150,&local_b0);
    poVar6 = std::operator<<(poVar6,(string *)&local_150);
    std::endl<char,std::char_traits<char>>(poVar6);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_b0);
    poVar6 = std::operator<<(internalDepends," ");
    poVar6 = std::operator<<(poVar6,(string *)(p_Var7 + 1));
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::endl<char,std::char_traits<char>>(makeDepends);
  p_Var7 = (local_158->Requires)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  psVar3 = &local_158->Requires;
  psVar2 = &local_158->Provides;
  local_128 = &(local_158->Provides)._M_t._M_impl.super__Rb_tree_header._M_header;
  do {
    if ((_Rb_tree_header *)p_Var7 == &(psVar3->_M_t)._M_impl.super__Rb_tree_header) {
      if ((local_158->Provides)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        p_Var11 = (local_158->Provides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (p_Var11 != local_128) {
          local_130 = p_Var11;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this->Internal,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var11 + 1));
          std::__cxx11::string::string((string *)&local_150,(string *)local_b8);
          std::__cxx11::string::append((char *)&local_150);
          std::__cxx11::string::append((string *)&local_150);
          pcVar1 = (this->super_cmDepends).LocalGenerator;
          MaybeConvertToRelativePath(&local_120,this,&local_e0,&local_150);
          cmOutputConverter::ConvertToOutputFormat
                    (&local_b0,&pcVar1->super_cmOutputConverter,&local_120,SHELL);
          std::__cxx11::string::operator=((string *)&local_150,(string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::string((string *)&local_b0,(string *)local_c0);
          std::__cxx11::string::append((char *)&local_b0);
          std::__cxx11::string::append((string *)&local_b0);
          std::__cxx11::string::append((char *)&local_b0);
          MaybeConvertToRelativePath(&local_120,this,&local_e0,&local_b0);
          std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          cmOutputConverter::ConvertToOutputFormat
                    (&local_120,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                     &local_b0,SHELL);
          cmSystemTools::ConvertToOutputPath(&local_90,&local_b0);
          poVar6 = std::operator<<(makeDepends,(string *)&local_100);
          poVar6 = std::operator<<(poVar6,".provides.build");
          poVar6 = std::operator<<(poVar6,": ");
          poVar6 = std::operator<<(poVar6,(string *)&local_90);
          std::operator<<(poVar6,"\n");
          poVar6 = std::operator<<(makeDepends,(string *)&local_90);
          poVar6 = std::operator<<(poVar6,": ");
          poVar6 = std::operator<<(poVar6,(string *)&local_100);
          std::operator<<(poVar6,"\n");
          poVar6 = std::operator<<(makeDepends,"\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod ");
          poVar6 = std::operator<<(poVar6,(string *)&local_150);
          poVar6 = std::operator<<(poVar6," ");
          std::operator<<(poVar6,(string *)&local_120);
          this_00 = ((this->super_cmDepends).LocalGenerator)->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"CMAKE_Fortran_COMPILER_ID",&local_159);
          pcVar10 = cmMakefile::GetDefinition(this_00,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
            poVar6 = std::operator<<(makeDepends," ");
            std::operator<<(poVar6,pcVar10);
          }
          std::operator<<(makeDepends,"\n");
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_150);
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(local_130);
        }
        poVar6 = std::operator<<(makeDepends,(string *)&local_100);
        std::operator<<(poVar6,".provides.build:\n");
        poVar6 = std::operator<<(makeDepends,"\t$(CMAKE_COMMAND) -E touch ");
        poVar6 = std::operator<<(poVar6,(string *)&local_100);
        std::operator<<(poVar6,".provides.build\n");
        std::__cxx11::string::string
                  ((string *)&local_150,(string *)&(this->super_cmDepends).TargetDirectory);
        std::__cxx11::string::append((char *)&local_150);
        MaybeConvertToRelativePath(&local_120,this,&local_e0,&local_150);
        cmSystemTools::ConvertToOutputPath(&local_b0,&local_120);
        std::__cxx11::string::operator=((string *)&local_150,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_120);
        poVar6 = std::operator<<(makeDepends,(string *)&local_150);
        poVar6 = std::operator<<(poVar6,": ");
        poVar6 = std::operator<<(poVar6,(string *)&local_100);
        std::operator<<(poVar6,".provides.build\n");
        std::__cxx11::string::~string((string *)&local_150);
      }
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_e0);
      return true;
    }
    __k = p_Var7 + 1;
    local_130 = p_Var7;
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&psVar2->_M_t,(key_type *)__k);
    if (cVar8._M_node == local_128) {
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(this->Internal->TargetRequires)._M_t,(key_type *)__k);
      if ((_Rb_tree_header *)iVar9._M_node ==
          &(this->Internal->TargetRequires)._M_t._M_impl.super__Rb_tree_header) {
        abort();
      }
      if (iVar9._M_node[2]._M_parent == (_Base_ptr)0x0) {
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        local_150._M_string_length = 0;
        local_150.field_2._M_local_buf[0] = '\0';
        bVar4 = FindModule(this,(string *)__k,&local_150);
        if (bVar4) {
          MaybeConvertToRelativePath(&local_120,this,&local_e0,&local_150);
          cmSystemTools::ConvertToOutputPath(&local_b0,&local_120);
          std::__cxx11::string::operator=((string *)&local_150,(string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_120);
          poVar6 = std::operator<<(makeDepends,(string *)&local_100);
          poVar6 = std::operator<<(poVar6,": ");
          poVar6 = std::operator<<(poVar6,(string *)&local_150);
          std::operator<<(poVar6,"\n");
        }
      }
      else {
        MaybeConvertToRelativePath(&local_b0,this,&local_e0,(string *)(iVar9._M_node + 2));
        cmSystemTools::ConvertToOutputPath(&local_150,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        poVar6 = std::operator<<(makeDepends,(string *)&local_100);
        poVar6 = std::operator<<(poVar6,": ");
        poVar6 = std::operator<<(poVar6,(string *)&local_150);
        std::operator<<(poVar6,"\n");
      }
      std::__cxx11::string::~string((string *)&local_150);
    }
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(local_130);
  } while( true );
}

Assistant:

bool cmDependsFortran::WriteDependenciesReal(std::string const& obj,
                                             cmFortranSourceInfo const& info,
                                             std::string const& mod_dir,
                                             std::string const& stamp_dir,
                                             std::ostream& makeDepends,
                                             std::ostream& internalDepends)
{
  typedef cmDependsFortranInternals::TargetRequiresMap TargetRequiresMap;

  // Get the source file for this object.
  std::string const& src = info.Source;

  // Write the include dependencies to the output stream.
  std::string binDir = this->LocalGenerator->GetBinaryDirectory();
  std::string obj_i = this->MaybeConvertToRelativePath(binDir, obj);
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i);
  internalDepends << obj_i << std::endl;
  internalDepends << " " << src << std::endl;
  for (std::string const& i : info.Includes) {
    makeDepends << obj_m << ": "
                << cmSystemTools::ConvertToOutputPath(
                     this->MaybeConvertToRelativePath(binDir, i))
                << std::endl;
    internalDepends << " " << i << std::endl;
  }
  makeDepends << std::endl;

  // Write module requirements to the output stream.
  for (std::string const& i : info.Requires) {
    // Require only modules not provided in the same source.
    if (info.Provides.find(i) != info.Provides.cend()) {
      continue;
    }

    // The object file should depend on timestamped files for the
    // modules it uses.
    TargetRequiresMap::const_iterator required =
      this->Internal->TargetRequires.find(i);
    if (required == this->Internal->TargetRequires.end()) {
      abort();
    }
    if (!required->second.empty()) {
      // This module is known.  Depend on its timestamp file.
      std::string stampFile = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, required->second));
      makeDepends << obj_m << ": " << stampFile << "\n";
    } else {
      // This module is not known to CMake.  Try to locate it where
      // the compiler will and depend on that.
      std::string module;
      if (this->FindModule(i, module)) {
        module = cmSystemTools::ConvertToOutputPath(
          this->MaybeConvertToRelativePath(binDir, module));
        makeDepends << obj_m << ": " << module << "\n";
      }
    }
  }

  // If any modules are provided then they must be converted to stamp files.
  if (!info.Provides.empty()) {
    // Create a target to copy the module after the object file
    // changes.
    for (std::string const& i : info.Provides) {
      // Include this module in the set provided by this target.
      this->Internal->TargetProvides.insert(i);

      // Always use lower case for the mod stamp file name.  The
      // cmake_copy_f90_mod will call back to this class, which will
      // try various cases for the real mod file name.
      std::string modFile = mod_dir;
      modFile += "/";
      modFile += i;
      modFile = this->LocalGenerator->ConvertToOutputFormat(
        this->MaybeConvertToRelativePath(binDir, modFile),
        cmOutputConverter::SHELL);
      std::string stampFile = stamp_dir;
      stampFile += "/";
      stampFile += i;
      stampFile += ".stamp";
      stampFile = this->MaybeConvertToRelativePath(binDir, stampFile);
      std::string const stampFileForShell =
        this->LocalGenerator->ConvertToOutputFormat(stampFile,
                                                    cmOutputConverter::SHELL);
      std::string const stampFileForMake =
        cmSystemTools::ConvertToOutputPath(stampFile);

      makeDepends << obj_m << ".provides.build"
                  << ": " << stampFileForMake << "\n";
      // Note that when cmake_copy_f90_mod finds that a module file
      // and the corresponding stamp file have no differences, the stamp
      // file is not updated. In such case the stamp file will be always
      // older than its prerequisite and trigger cmake_copy_f90_mod
      // on each new build. This is expected behavior for incremental
      // builds and can not be changed without preforming recursive make
      // calls that would considerably slow down the building process.
      makeDepends << stampFileForMake << ": " << obj_m << "\n";
      makeDepends << "\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod " << modFile
                  << " " << stampFileForShell;
      cmMakefile* mf = this->LocalGenerator->GetMakefile();
      const char* cid = mf->GetDefinition("CMAKE_Fortran_COMPILER_ID");
      if (cid && *cid) {
        makeDepends << " " << cid;
      }
      makeDepends << "\n";
    }
    makeDepends << obj_m << ".provides.build:\n";
    // After copying the modules update the timestamp file.
    makeDepends << "\t$(CMAKE_COMMAND) -E touch " << obj_m
                << ".provides.build\n";

    // Make sure the module timestamp rule is evaluated by the time
    // the target finishes building.
    std::string driver = this->TargetDirectory;
    driver += "/build";
    driver = cmSystemTools::ConvertToOutputPath(
      this->MaybeConvertToRelativePath(binDir, driver));
    makeDepends << driver << ": " << obj_m << ".provides.build\n";
  }

  return true;
}